

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_builder.cxx
# Opt level: O1

void xray_re::xr_mesh_builder::create_unique_array<xray_re::_vector3<float>>
               (b_proxy_vec *refs,
               vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_> *data,
               _vector3<float> *raw_data,uint32_t *mapping)

{
  pointer *pp_Var1;
  _vector3<float> *__args;
  float *pfVar2;
  float fVar3;
  __normal_iterator<xray_re::xr_mesh_builder::b_proxy_*,_std::vector<xray_re::xr_mesh_builder::b_proxy,_std::allocator<xray_re::xr_mesh_builder::b_proxy>_>_>
  __first;
  __normal_iterator<xray_re::xr_mesh_builder::b_proxy_*,_std::vector<xray_re::xr_mesh_builder::b_proxy,_std::allocator<xray_re::xr_mesh_builder::b_proxy>_>_>
  __last;
  pointer pbVar4;
  iterator __position;
  long lVar5;
  ulong uVar6;
  pointer pbVar7;
  uint32_t uVar8;
  
  __first._M_current =
       (refs->
       super__Vector_base<xray_re::xr_mesh_builder::b_proxy,_std::allocator<xray_re::xr_mesh_builder::b_proxy>_>
       )._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (refs->
       super__Vector_base<xray_re::xr_mesh_builder::b_proxy,_std::allocator<xray_re::xr_mesh_builder::b_proxy>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    uVar6 = (long)__last._M_current - (long)__first._M_current >> 2;
    lVar5 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<xray_re::xr_mesh_builder::b_proxy*,std::vector<xray_re::xr_mesh_builder::b_proxy,std::allocator<xray_re::xr_mesh_builder::b_proxy>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<xray_re::xr_mesh_builder::b_proxy::less<xray_re::_vector3<float>>>>
              (__first,__last,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<xray_re::xr_mesh_builder::b_proxy::less<xray_re::_vector3<float>_>_>
               )raw_data);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<xray_re::xr_mesh_builder::b_proxy*,std::vector<xray_re::xr_mesh_builder::b_proxy,std::allocator<xray_re::xr_mesh_builder::b_proxy>>>,__gnu_cxx::__ops::_Iter_comp_iter<xray_re::xr_mesh_builder::b_proxy::less<xray_re::_vector3<float>>>>
              (__first,__last,
               (_Iter_comp_iter<xray_re::xr_mesh_builder::b_proxy::less<xray_re::_vector3<float>_>_>
               )raw_data);
  }
  pbVar7 = (refs->
           super__Vector_base<xray_re::xr_mesh_builder::b_proxy,_std::allocator<xray_re::xr_mesh_builder::b_proxy>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (refs->
           super__Vector_base<xray_re::xr_mesh_builder::b_proxy,_std::allocator<xray_re::xr_mesh_builder::b_proxy>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar7 != pbVar4) {
    uVar8 = 0;
    do {
      __args = raw_data + pbVar7->index;
      __position._M_current =
           (data->
           super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (data->
          super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<xray_re::_vector3<float>,std::allocator<xray_re::_vector3<float>>>::
        _M_realloc_insert<xray_re::_vector3<float>const&>
                  ((vector<xray_re::_vector3<float>,std::allocator<xray_re::_vector3<float>>> *)data
                   ,__position,__args);
      }
      else {
        ((__position._M_current)->field_0).field_0.z = (__args->field_0).field_0.z;
        *(undefined8 *)&(__position._M_current)->field_0 = *(undefined8 *)&__args->field_0;
        pp_Var1 = &(data->
                   super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *pp_Var1 = *pp_Var1 + 1;
      }
      uVar6 = (ulong)pbVar7->index;
      while( true ) {
        mapping[uVar6] = uVar8;
        pbVar7 = pbVar7 + 1;
        if (pbVar7 == pbVar4) break;
        uVar6 = (ulong)pbVar7->index;
        fVar3 = raw_data[uVar6].field_0.field_0.x;
        if ((fVar3 != (__args->field_0).field_0.x) ||
           (NAN(fVar3) || NAN((__args->field_0).field_0.x))) break;
        fVar3 = raw_data[uVar6].field_0.field_0.y;
        pfVar2 = &(__args->field_0).field_0.y;
        if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) break;
        fVar3 = raw_data[uVar6].field_0.field_0.z;
        pfVar2 = &(__args->field_0).field_0.z;
        if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) break;
      }
      uVar8 = uVar8 + 1;
    } while (pbVar7 != pbVar4);
  }
  return;
}

Assistant:

void
xr_mesh_builder::create_unique_array(b_proxy_vec& refs, std::vector<T>& data, const T* raw_data, uint32_t* mapping)
{
	std::sort(refs.begin(), refs.end(), b_proxy::less<T>(raw_data));
	uint32_t index = 0;
	for (b_proxy_vec_it it = refs.begin(), end = refs.end(); it != end; ++index) {
		const T& value = raw_data[it->index];
		data.push_back(value);
		mapping[it->index] = index;
		while (++it != end && raw_data[it->index] == value)
			mapping[it->index] = index;
	}
}